

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ech_calc_confirmation
              (ptls_key_schedule_t *sched,void *dst,uint8_t *inner_random,char *label,
              ptls_iovec_t message)

{
  ptls_hash_algorithm_t *algo;
  size_t sVar1;
  ptls_iovec_t hash_value;
  int iVar2;
  st_ptls_hash_context_t *psVar3;
  ptls_iovec_t secret_00;
  ptls_iovec_t ikm;
  uint8_t secret [64];
  uint8_t transcript_hash [64];
  uint8_t local_b8 [64];
  uint8_t local_78 [72];
  
  psVar3 = sched->hashes[0].ctx;
  psVar3 = (*psVar3->clone_)(psVar3);
  if (psVar3 == (st_ptls_hash_context_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    (*psVar3->update)(psVar3,message.base,message.len);
    (*psVar3->final)(psVar3,local_78,PTLS_HASH_FINAL_MODE_FREE);
    ikm.len = 0x20;
    ikm.base = inner_random;
    iVar2 = ptls_hkdf_extract(sched->hashes[0].algo,local_b8,(ptls_iovec_t)ZEXT816(0),ikm);
    if (iVar2 == 0) {
      algo = sched->hashes[0].algo;
      sVar1 = algo->digest_size;
      hash_value.len = sVar1;
      hash_value.base = local_78;
      secret_00.len = sVar1;
      secret_00.base = local_b8;
      iVar2 = ptls_hkdf_expand_label(algo,dst,8,secret_00,label,hash_value,(char *)0x0);
    }
  }
  (*ptls_clear_memory)(local_b8,0x40);
  (*ptls_clear_memory)(local_78,0x40);
  return iVar2;
}

Assistant:

static int ech_calc_confirmation(ptls_key_schedule_t *sched, void *dst, const uint8_t *inner_random, const char *label,
                                 ptls_iovec_t message)
{
    ptls_hash_context_t *hash = NULL;
    uint8_t secret[PTLS_MAX_DIGEST_SIZE], transcript_hash[PTLS_MAX_DIGEST_SIZE];
    int ret;

    /* calc transcript hash using the modified ServerHello / HRR */
    if ((hash = sched->hashes[0].ctx->clone_(sched->hashes[0].ctx)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    hash->update(hash, message.base, message.len);
    hash->final(hash, transcript_hash, PTLS_HASH_FINAL_MODE_FREE);
    hash = NULL;

    /* HKDF extract and expand */
    if ((ret = ptls_hkdf_extract(sched->hashes[0].algo, secret, ptls_iovec_init(NULL, 0),
                                 ptls_iovec_init(inner_random, PTLS_HELLO_RANDOM_SIZE))) != 0)
        goto Exit;
    if ((ret = ptls_hkdf_expand_label(sched->hashes[0].algo, dst, 8, ptls_iovec_init(secret, sched->hashes[0].algo->digest_size),
                                      label, ptls_iovec_init(transcript_hash, sched->hashes[0].algo->digest_size), NULL)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    ptls_clear_memory(transcript_hash, sizeof(transcript_hash));
    if (hash != NULL)
        hash->final(hash, NULL, PTLS_HASH_FINAL_MODE_FREE);
    return ret;
}